

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::InverseWaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  ostream *poVar5;
  int n;
  int k;
  int iVar6;
  int n_00;
  int iVar7;
  ulong __n;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  int local_68;
  int local_64;
  _OutputArray local_60;
  _InputArray local_48;
  
  if (*(long *)(src + 0x10) != 0) {
    iVar1 = **(int **)(src + 0x40);
    iVar2 = (*(int **)(src + 0x40))[1];
    local_68 = iVar2;
    local_64 = iVar1;
    cv::Mat::create(dest,&local_68,*(uint *)src & 0xfff);
    local_60.super__InputArray.obj = &components;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_60.super__InputArray.flags = 0x2050000;
    local_48.obj = src;
    cv::split(&local_48,&local_60);
    n = *ww;
    n_00 = *wh;
    if (n_00 != 0 && n != 0) {
      for (; (n <= iVar2 && (n_00 <= iVar1)); n_00 = n_00 * 2) {
        iVar3 = 0;
        if (0 < n) {
          iVar3 = n;
        }
        iVar7 = 0;
        if (0 < n_00) {
          iVar7 = n_00;
        }
        for (__n = 0; __n < (ulong)(((long)components.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)components.
                                          super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start) / 0x60);
            __n = __n + 1) {
          for (iVar6 = 0; iVar3 != iVar6; iVar6 = iVar6 + 1) {
            pvVar4 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,__n);
            Wavegeneral_v(pvVar4,iVar6,n_00,-1,P,Q,fsize);
          }
          for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
            pvVar4 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,__n);
            Wavegeneral_h(pvVar4,iVar6,n,-1,P,Q,fsize);
          }
        }
        n = n * 2;
      }
      local_48.sz.width = 0;
      local_48.sz.height = 0;
      local_60.super__InputArray.sz.width = 0;
      local_60.super__InputArray.sz.height = 0;
      local_48.flags = 0x1050000;
      local_48.obj = &components;
      local_60.super__InputArray.flags = 0x2010000;
      local_60.super__InputArray.obj = dest;
      cv::merge(&local_48,&local_60);
    }
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&components);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"InverseWaveletTransform2D() src == NULL");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void lts2::InverseWaveletTransform2D(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int *ww, int *wh)
{
  if (!src.data) {
    std::cerr << "InverseWaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  dest.create(imageSize, src.type());
	
//	int width = imageSize.width; //XBDW(src)-XBUP(src);
//	int height = imageSize.height; //YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int width = *ww; 
  int height = *wh;
	
  if (width == 0 || height == 0)
    return;
    
  while(width <= imageSize.width && height <= imageSize.height) 
  {
    for(int b = 0; b < components.size(); ++b) 
    {  
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, -1, P, Q, fsize);
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, -1, P, Q, fsize);
    }
    width *= 2;
    height *= 2;
  }
    
  cv::merge(components, dest);
}